

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-utils.cpp
# Opt level: O3

unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
* wasm::ParamUtils::getUsedParams
            (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
             *__return_storage_ptr__,Function *func,Module *module)

{
  map<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_unsigned_long,_std::less<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
  *pmVar1;
  size_t *psVar2;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *puVar3;
  undefined8 *puVar4;
  long *plVar5;
  vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *pvVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  pointer puVar7;
  pointer puVar8;
  bool bVar9;
  pointer puVar10;
  pointer puVar11;
  int iVar12;
  size_t sVar13;
  size_type sVar14;
  undefined1 auVar15 [8];
  __node_base_ptr p_Var16;
  _Hash_node_base *p_Var17;
  _Hash_node_base *p_Var18;
  _Hash_node_base *p_Var19;
  __node_ptr __node;
  pointer puVar20;
  Expression **ppEVar21;
  ulong uVar22;
  SetOfLocals *__bkt;
  SetOfLocals *live_00;
  SetOfLocals *extraout_RDX;
  SetOfLocals *live_01;
  BasicBlock *this_00;
  _Link_type __x;
  ParamLiveness *pPVar23;
  size_type in_R8;
  pointer __ptr_4;
  key_type *ppBVar24;
  __hashtable *__h;
  _Hash_node_base *p_Var25;
  BasicBlock *pBVar26;
  __node_base_ptr p_Var27;
  long lVar28;
  size_type sVar29;
  _Hash_node_base *p_Var30;
  vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *actions;
  ulong uVar31;
  undefined8 *puVar32;
  pointer puVar33;
  undefined1 auStack_3f8 [8];
  ParamLiveness walker;
  iterator __end0;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *usedParams;
  BasicBlock *curr;
  pointer local_e8;
  ulong local_e0;
  _Hash_node_base *local_d8;
  _Hash_node_base *local_d0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_c8;
  undefined1 local_b0 [8];
  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  queue;
  undefined1 local_70 [8];
  uint live;
  __node_base local_60;
  _Hash_node_base *p_Stack_58;
  _Prime_rehash_policy local_50;
  __node_base_ptr p_Stack_40;
  _Hash_node_base *local_38;
  
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
        super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches;
  auStack_3f8 = (undefined1  [8])0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep = (Expression **)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl._0_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed._M_elems[9].currp =
       (Expression **)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currFunction = (Function *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule = (Module *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.entry =
       (BasicBlock *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit =
       (BasicBlock *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
  super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.loopTops.
  super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.loopTops.
  super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pmVar1 = &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            debugIds;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl._0_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_left =
       walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
       super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches.
       _M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  memset(&walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
          branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right,0,0xb2);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>._560_8_ =
       &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks.
        _M_h._M_rehash_policy._M_next_resize;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_buckets = (__buckets_ptr)0x1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_bucket_count = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_element_count =
       CONCAT44(walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                liveBlocks._M_h._M_element_count._4_4_,0x3f800000);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  denseStorage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)&walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 copies.sparseStorage._M_h._M_rehash_policy._M_next_resize;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_rehash_policy._M_max_load_factor = 0.0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_rehash_policy._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_rehash_policy._M_next_resize = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_single_bucket = (__node_base_ptr)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  denseStorage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  denseStorage.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_buckets = (__buckets_ptr)0x1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_bucket_count = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_element_count._0_4_ = 0x3f800000;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_rehash_policy._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_rehash_policy._M_next_resize = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.
  sparseStorage._M_h._M_single_bucket._0_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies.N = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies._84_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)func;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currFunction = (Function *)module
  ;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar1;
  sVar13 = Function::getNumLocals(func);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_node_count._0_4_ = (uint)sVar13;
  sparse_square_matrix<unsigned_char>::recreate
            ((sparse_square_matrix<unsigned_char> *)
             &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
              liveBlocks._M_h._M_single_bucket,
             (uint)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                   super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                   .debugIds._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               copies._80_8_) {
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.totalCopies.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)walker.
                        super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                        copies._80_8_;
  }
  __x = (_Link_type)
        (ulong)(uint)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                     .
                     super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                     .debugIds._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.copies
              .N,(size_type)__x);
  puVar10 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar26 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit;
  this_00 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit;
  if ((BasicBlock *)
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks
      .
      super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit) {
    do {
      std::
      unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
      ::~unique_ptr((unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
                     *)this_00);
      this_00 = (BasicBlock *)
                &(this_00->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                 .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    } while (this_00 != (BasicBlock *)puVar10);
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
    super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar26;
  }
  std::
  _Rb_tree<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
  ::_M_erase((_Rb_tree<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>,_std::_Select1st<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>,_std::less<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<std::pair<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*const,_unsigned_long>_>_>
              *)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                debugIds._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,__x);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.entry =
       (BasicBlock *)0x0;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.catchIndexStack
  .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = '\0';
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)pmVar1;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.debugIds._M_t.
  _M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)pmVar1;
  CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::startBasicBlock
            ((CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *)
             auStack_3f8);
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
  super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule =
       (Module *)
       walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
       super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.loopTops.
       super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (((long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
             super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
             super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start -
       (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
             super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
             super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed._M_elems
             [9].currp >> 4) +
      (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep != 0) {
    __assert_fail("stack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x12d,
                  "void wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::walk(Expression *&) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>]"
                 );
  }
  Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::pushTask
            ((Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)auStack_3f8,
             CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::scan,
             &func->body);
  pPVar23 = (ParamLiveness *)
            (((long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start -
              (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed.
                    _M_elems[9].currp >> 4) +
            (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                  .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep);
  while (pPVar23 != (ParamLiveness *)0x0) {
    if ((pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                 super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed.
                 _M_elems[9].currp ==
        walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
        super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
        super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
        super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
          super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep ==
          (Expression **)0x0) {
        __assert_fail("usedFixed > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                      ,0x7e,
                      "T &wasm::SmallVector<wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::Task, 10>::back() [T = wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::Task, N = 10]"
                     );
      }
      ppEVar21 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                 super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                 super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed.
                 _M_elems[(long)walker.
                                super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                .
                                super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                                .
                                super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                .super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                                replacep + -2].currp;
      auStack_3f8 = (undefined1  [8])
                    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed.
                    _M_elems[(long)walker.
                                   super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                   .
                                   super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                                   .
                                   super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                   .super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                                   .replacep + -1].func;
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep =
           (Expression **)
           ((long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                  .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                  super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep + -1);
    }
    else {
      ppEVar21 = (Expression **)
                 ((pointer)
                 ((long)walker.
                        super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                        super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                        .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                        super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.
                        flexible.
                        super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
                        ._M_impl.super__Vector_impl_data._M_start + 0xfffffffffffffff0))->func;
      auStack_3f8 = (undefined1  [8])
                    ((pointer)
                    ((long)walker.
                           super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                           super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                           .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                           super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.
                           flexible.
                           super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
                           ._M_impl.super__Vector_impl_data._M_start + 0xfffffffffffffff0))->currp;
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((long)walker.
                           super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                           super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                           .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                           super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.
                           flexible.
                           super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
                           ._M_impl.super__Vector_impl_data._M_start + 0xfffffffffffffff0);
    }
    if (*(Expression **)auStack_3f8 == (Expression *)0x0) {
      __assert_fail("*task.currp",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                    ,0x132,
                    "void wasm::Walker<ParamLiveness, wasm::Visitor<ParamLiveness>>::walk(Expression *&) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>]"
                   );
    }
    (*(code *)ppEVar21)((ParamLiveness *)auStack_3f8,(Expression **)auStack_3f8);
    pPVar23 = (ParamLiveness *)
              (((long)walker.
                      super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                      .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                      super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.
                      flexible.
                      super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
                      ._M_impl.super__Vector_impl_data._M_start -
                (long)walker.
                      super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                      .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                      super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed.
                      _M_elems[9].currp >> 4) +
              (long)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.replacep);
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.loopTops.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::doEndReturn
              ((CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness> *)
               auStack_3f8,(ParamLiveness *)0x0,
               walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.fixed._M_elems
               [9].currp);
  }
  if ((char)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            catchIndexStack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage == '\x01') {
    local_b0 = (undefined1  [8])
               walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               entry;
    std::
    vector<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
    ::push_back((vector<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                 *)&walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .exit,(value_type *)local_b0);
    std::
    unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
    ::~unique_ptr((unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>
                   *)local_b0);
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.branches.
      _M_t._M_impl.super__Rb_tree_header._M_header._M_right != (_Base_ptr)0x0) {
    __assert_fail("branches.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x255,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      ifLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               branches._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    __assert_fail("ifLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x256,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      loopLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      ifLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("loopLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,599,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      tryLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      loopLastBlockStack.
      super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("tryLastBlockStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,600,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      throwingInstsStack.
      super__Vector_base<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               tryLastBlockStack.
               super__Vector_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("throwingInstsStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x259,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if ((pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               tryStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_start !=
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      throwingInstsStack.
      super__Vector_base<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("tryStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x25a,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      processCatchStack.
      super__Vector_base<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>,_std::allocator<std::vector<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
               super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
               tryStack.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage) {
    __assert_fail("processCatchStack.size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/cfg-traversal.h"
                  ,0x25b,
                  "void wasm::CFGWalker<ParamLiveness, wasm::Visitor<ParamLiveness>, wasm::Liveness>::doWalkFunction(Function *) [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>, Contents = wasm::Liveness]"
                 );
  }
  local_70 = (undefined1  [8])&p_Stack_40;
  _live = (key_type *)0x1;
  local_60._M_nxt = (_Hash_node_base *)0x0;
  p_Stack_58 = (_Hash_node_base *)0x0;
  local_50._M_max_load_factor = 1.0;
  local_50._M_next_resize = 0;
  p_Stack_40 = (__node_base_ptr)0x0;
  local_b0 = (undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize;
  queue._M_h._M_buckets = (__buckets_ptr)0x1;
  queue._M_h._M_bucket_count = 0;
  queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  queue._M_h._M_element_count._0_4_ = 0x3f800000;
  queue._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  queue._M_h._M_rehash_policy._4_4_ = 0;
  queue._M_h._M_rehash_policy._M_next_resize = 0;
  std::
  unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
  ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
            *)local_b0,
           (value_type *)
           &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule);
  puVar32 = (undefined8 *)queue._M_h._M_bucket_count;
  if (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    do {
      puVar3 = *(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 **)(queue._M_h._M_bucket_count + 8);
      usedParams = puVar3;
      std::
      unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ::erase((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
               *)local_b0,(iterator)queue._M_h._M_bucket_count);
      std::
      unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
      ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                *)local_70,(value_type *)&usedParams);
      p_Var30 = (_Hash_node_base *)puVar3[1]._M_h._M_element_count;
      for (p_Var25 = puVar3[1]._M_h._M_before_begin._M_nxt; p_Var25 != p_Var30;
          p_Var25 = p_Var25 + 1) {
        local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)p_Var25->_M_nxt;
        sVar14 = std::
                 unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                          *)local_70,_live);
        if (sVar14 == 0) {
          std::
          unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
          ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                    *)local_b0,(value_type *)&local_c8);
        }
      }
      puVar32 = (undefined8 *)queue._M_h._M_bucket_count;
    } while (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0);
  }
  while (puVar32 != (undefined8 *)0x0) {
    puVar4 = (undefined8 *)*puVar32;
    operator_delete(puVar32,0x10);
    puVar32 = puVar4;
  }
  memset((void *)local_b0,0,(long)queue._M_h._M_buckets << 3);
  queue._M_h._M_bucket_count = 0;
  queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  psVar2 = &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            liveBlocks._M_h._M_rehash_policy._M_next_resize;
  if ((undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize != local_b0) {
    operator_delete((void *)local_b0,(long)queue._M_h._M_buckets << 3);
  }
  auVar15 = (undefined1  [8])&p_Stack_40;
  puVar32 = (undefined8 *)
            walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            liveBlocks._M_h._M_bucket_count;
  while (puVar32 != (undefined8 *)0x0) {
    puVar4 = (undefined8 *)*puVar32;
    operator_delete(puVar32,0x10);
    puVar32 = puVar4;
  }
  if (psVar2 != (size_t *)
                walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                _560_8_) {
    operator_delete((void *)walker.
                            super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                            ._560_8_,
                    (long)walker.
                          super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                          liveBlocks._M_h._M_buckets << 3);
  }
  ppBVar24 = _live;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_element_count = local_50._0_8_;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_rehash_policy._0_8_ = local_50._M_next_resize;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>._560_8_ = local_70
  ;
  if (auVar15 == local_70) {
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
    _M_rehash_policy._M_next_resize = (size_t)p_Stack_40;
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>._560_8_ = psVar2
    ;
  }
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_buckets = (__buckets_ptr)_live;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_bucket_count = (size_type)local_60._M_nxt;
  walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks._M_h.
  _M_before_begin._M_nxt = p_Stack_58;
  if (local_60._M_nxt != (_Hash_node_base *)0x0) {
    *(size_type **)
     (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>._560_8_ +
     ((ulong)local_60._M_nxt[1]._M_nxt % (ulong)_live) * 8) =
         &walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks
          ._M_h._M_bucket_count;
  }
  local_70 = (undefined1  [8])0x0;
  local_60._M_nxt = (__node_base_ptr)0x0;
  p_Stack_40 = (__node_base_ptr)0x0;
  if (_live != (key_type *)0x1) {
    auVar15 = (undefined1  [8])
              __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                        ((new_allocator<std::__detail::_Hash_node_base_*> *)local_b0,
                         (size_type)_live,(void *)0x0);
    memset((void *)auVar15,0,(long)ppBVar24 << 3);
  }
  sVar29 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
           liveBlocks._M_h._M_bucket_count;
  pBVar26 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit;
  puVar10 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
            super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
            basicBlocks.
            super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppBVar24 = _live;
  if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.liveBlocks.
      _M_h._M_bucket_count != 0) {
    local_70 = auVar15;
    local_60._M_nxt = (_Hash_node_base *)operator_new(0x10);
    (local_60._M_nxt)->_M_nxt = (_Hash_node_base *)0x0;
    p_Var25 = *(_Hash_node_base **)(sVar29 + 8);
    local_60._M_nxt[1]._M_nxt = p_Var25;
    (&((_Hashtable *)local_70)->_M_buckets)[(ulong)p_Var25 % (ulong)_live] = &local_60._M_nxt;
    p_Var27 = local_60._M_nxt;
    for (puVar32 = *(undefined8 **)sVar29;
        pBVar26 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                  .exit,
        puVar10 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                  super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                  .basicBlocks.
                  super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, auVar15 = local_70, ppBVar24 = _live,
        puVar32 != (undefined8 *)0x0; puVar32 = (undefined8 *)*puVar32) {
      p_Var16 = (__node_base_ptr)operator_new(0x10);
      p_Var16->_M_nxt = (_Hash_node_base *)0x0;
      p_Var16[1]._M_nxt = (_Hash_node_base *)puVar32[1];
      p_Var27->_M_nxt = p_Var16;
      uVar22 = (ulong)p_Var16[1]._M_nxt % (ulong)_live;
      if ((&((_Hashtable *)local_70)->_M_buckets)[uVar22] == (__buckets_ptr)0x0) {
        (&((_Hashtable *)local_70)->_M_buckets)[uVar22] = &p_Var27->_M_nxt;
      }
      p_Var27 = p_Var16;
    }
  }
  do {
    puVar11 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
              super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
              basicBlocks.
              super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_70 = auVar15;
    _live = ppBVar24;
    if (pBVar26 ==
        (BasicBlock *)
        walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
        super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
        basicBlocks.
        super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks
      .
      super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = puVar10;
      p_Var27 = local_60._M_nxt;
      while (p_Var27 != (__node_base_ptr)0x0) {
        p_Var25 = p_Var27->_M_nxt;
        operator_delete(p_Var27,0x10);
        p_Var27 = p_Var25;
      }
      memset((void *)local_70,0,(long)_live << 3);
      local_60._M_nxt = (_Hash_node_base *)0x0;
      p_Stack_58 = (_Hash_node_base *)0x0;
      if ((undefined1  [8])&p_Stack_40 != local_70) {
        operator_delete((void *)local_70,(long)_live << 3);
      }
      puVar10 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                basicBlocks.
                super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_b0 = (undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize;
      queue._M_h._M_buckets = (__buckets_ptr)0x1;
      queue._M_h._M_bucket_count = 0;
      queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      queue._M_h._M_element_count._0_4_ = 0x3f800000;
      queue._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      queue._M_h._M_rehash_policy._4_4_ = 0;
      queue._M_h._M_rehash_policy._M_next_resize = 0;
      pBVar26 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
                exit;
      puVar32 = (undefined8 *)queue._M_h._M_bucket_count;
      if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.exit !=
          (BasicBlock *)
          walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
          basicBlocks.
          super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          actions = (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                    (pBVar26->contents).start.
                    super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          sVar14 = std::
                   unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)walker.
                              super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>
                              ._560_8_,
                           (key_type *)
                           walker.
                           super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                           liveBlocks._M_h._M_buckets);
          if (sVar14 != 0) {
            __bkt = (SetOfLocals *)((ulong)actions % (ulong)queue._M_h._M_buckets);
            puVar20 = (&(((Liveness *)local_b0)->start).
                        super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start)[(long)__bkt];
            if (puVar20 != (pointer)0x0) {
              plVar5 = *(long **)puVar20;
              pvVar6 = (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                       plVar5[1];
              live_00 = __bkt;
              do {
                if (pvVar6 == actions) goto LAB_00771e31;
                plVar5 = (long *)*plVar5;
                if (plVar5 == (long *)0x0) break;
                pvVar6 = (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                         plVar5[1];
                live_00 = (SetOfLocals *)((ulong)pvVar6 % (ulong)queue._M_h._M_buckets);
              } while (live_00 == __bkt);
            }
            __node = (__node_ptr)operator_new(0x10);
            (__node->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
            *(vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> **)
             (__node->
             super__Hash_node_value<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_false>
             ).
             super__Hash_node_value_base<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>
             ._M_storage._M_storage.__data = actions;
            std::
            _Hashtable<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_insert_unique_node
                      ((_Hashtable<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                        *)local_b0,(size_type)__bkt,(__hash_code)actions,__node,in_R8);
            actions = (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                      (pBVar26->contents).start.
                      super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            live_00 = extraout_RDX;
LAB_00771e31:
            LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::
            scanLivenessThroughActions
                      ((LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)
                       (actions + 2),actions,live_00);
          }
          pBVar26 = (BasicBlock *)
                    &(pBVar26->contents).start.
                     super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        } while (pBVar26 != (BasicBlock *)puVar10);
        puVar32 = (undefined8 *)queue._M_h._M_bucket_count;
        if (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
          do {
            this = *(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                    (queue._M_h._M_bucket_count + 8);
            std::
            unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
            ::erase((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     *)local_b0,(iterator)queue._M_h._M_bucket_count);
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            puVar20 = this[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            if (this[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish != puVar20) {
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (&local_c8,*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)puVar20)
              ;
              puVar20 = this[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              if (8 < (ulong)((long)this[3].
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar20)) {
                uVar22 = 1;
                uVar31 = 2;
                do {
                  SortedVector::merge((SortedVector *)&usedParams,(SortedVector *)&local_c8,
                                      *(SortedVector **)(puVar20 + uVar22 * 2));
                  puVar7 = local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
                  puVar20 = local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)usedParams;
                  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)curr;
                  local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = local_e8;
                  usedParams = (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                *)0x0;
                  curr = (BasicBlock *)0x0;
                  local_e8 = (pointer)0x0;
                  if (((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)puVar20 !=
                       (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                        *)0x0) &&
                     (operator_delete(puVar20,(long)puVar7 - (long)puVar20),
                     usedParams !=
                     (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                      *)0x0)) {
                    operator_delete(usedParams,(long)local_e8 - (long)usedParams);
                  }
                  puVar20 = this[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  bVar9 = uVar31 < (ulong)((long)this[3].
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)puVar20 >> 3);
                  uVar22 = uVar31;
                  uVar31 = (ulong)((int)uVar31 + 1);
                } while (bVar9);
              }
              puVar20 = this[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              puVar7 = this[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
              uVar22 = (long)puVar7 - (long)puVar20;
              uVar31 = (long)local_c8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)local_c8.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
              if ((uVar22 != uVar31) ||
                 ((puVar7 != puVar20 &&
                  (iVar12 = bcmp(puVar20,local_c8.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start,uVar22),
                  iVar12 != 0)))) {
                if (uVar31 <= uVar22) {
                  __assert_fail("curr->contents.end.size() < live.size()",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/liveness-traversal.h"
                                ,0xf4,
                                "void wasm::LivenessWalker<ParamLiveness, wasm::Visitor<ParamLiveness>>::flowLiveness() [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>]"
                               );
                }
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                          (this + 1,&local_c8);
                LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::
                scanLivenessThroughActions
                          ((LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)
                           (this + 2),
                           (vector<wasm::LivenessAction,_std::allocator<wasm::LivenessAction>_> *)
                           &local_c8,live_01);
                puVar20 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                puVar7 = (this->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_finish;
                uVar22 = (long)puVar7 - (long)puVar20;
                uVar31 = (long)local_c8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_c8.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                if ((uVar22 != uVar31) ||
                   ((puVar7 != puVar20 &&
                    (iVar12 = bcmp(puVar20,local_c8.
                                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                           ._M_impl.super__Vector_impl_data._M_start,uVar22),
                    iVar12 != 0)))) {
                  if (uVar31 <= uVar22) {
                    __assert_fail("curr->contents.start.size() < live.size()",
                                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/cfg/liveness-traversal.h"
                                  ,0xfc,
                                  "void wasm::LivenessWalker<ParamLiveness, wasm::Visitor<ParamLiveness>>::flowLiveness() [SubType = ParamLiveness, VisitorType = wasm::Visitor<ParamLiveness>]"
                                 );
                  }
                  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                            (this,&local_c8);
                  puVar7 = this[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
                  for (puVar20 = this[4].
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start; puVar20 != puVar7;
                      puVar20 = puVar20 + 2) {
                    usedParams = *(unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                                   **)puVar20;
                    std::
                    unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                    ::insert((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                              *)local_b0,(value_type *)&usedParams);
                  }
                }
              }
            }
            if ((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)local_c8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start !=
                (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                 *)0x0) {
              operator_delete(local_c8.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_c8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_c8.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            puVar32 = (undefined8 *)queue._M_h._M_bucket_count;
          } while (queue._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0);
        }
      }
      while (puVar32 != (undefined8 *)0x0) {
        puVar4 = (undefined8 *)*puVar32;
        operator_delete(puVar32,0x10);
        puVar32 = puVar4;
      }
      memset((void *)local_b0,0,(long)queue._M_h._M_buckets << 3);
      queue._M_h._M_bucket_count = 0;
      queue._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      if ((undefined1  [8])&queue._M_h._M_rehash_policy._M_next_resize != local_b0) {
        operator_delete((void *)local_b0,(long)queue._M_h._M_buckets << 3);
      }
      walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
      super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
      super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task,_std::allocator<wasm::Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
          super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
          super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule ==
          (Module *)0x0) {
        *(undefined8 *)&(__return_storage_ptr__->_M_h)._M_rehash_policy = 0;
        (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket
        ;
        (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
        (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (__return_storage_ptr__->_M_h)._M_element_count = 0;
        (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
        (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
        (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
      }
      else {
        (__return_storage_ptr__->_M_h)._M_buckets = &(__return_storage_ptr__->_M_h)._M_single_bucket
        ;
        (__return_storage_ptr__->_M_h)._M_bucket_count = 1;
        (__return_storage_ptr__->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        (__return_storage_ptr__->_M_h)._M_element_count = 0;
        (__return_storage_ptr__->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
        (__return_storage_ptr__->_M_h)._M_rehash_policy._M_next_resize = 0;
        (__return_storage_ptr__->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
        puVar33 = ((walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                    .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                    super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule)->
                  exports).
                  super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar8 = ((walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                   super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>
                   .super_PostWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
                   super_Walker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.currModule)->
                 exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar33 != puVar8) {
          do {
            local_70._0_4_ =
                 *(undefined4 *)
                  &(puVar33->_M_t).
                   super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                   super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
            local_b0 = (undefined1  [8])__return_storage_ptr__;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)__return_storage_ptr__,local_70,local_b0);
            puVar33 = (pointer)((long)&(puVar33->_M_t).
                                       super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                       .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl +
                               4);
          } while (puVar33 != puVar8);
        }
      }
      LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>::~LivenessWalker
                ((LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_> *)auStack_3f8);
      return __return_storage_ptr__;
    }
    sVar29 = (size_type)
             (pBVar26->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
    super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar10;
    sVar14 = std::
             unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
             ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                      *)auVar15,ppBVar24);
    p_Var25 = *(_Hash_node_base **)(sVar29 + 0x60);
    p_Var30 = *(_Hash_node_base **)(sVar29 + 0x68);
    if (sVar14 == 0) {
      if (p_Var30 != p_Var25) {
        *(_Hash_node_base **)(sVar29 + 0x68) = p_Var25;
        sVar29 = (size_type)
                 (pBVar26->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>
                 .super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      if (*(long *)(sVar29 + 0x50) != *(long *)(sVar29 + 0x48)) {
        *(long *)(sVar29 + 0x50) = *(long *)(sVar29 + 0x48);
      }
    }
    else {
      uVar22 = (long)p_Var30 - (long)p_Var25;
      local_e0 = uVar22;
      local_d8 = p_Var25;
      queue._M_h._M_single_bucket = (__node_base_ptr)pBVar26;
      local_38 = (_Hash_node_base *)sVar29;
      if (0 < (long)uVar22 >> 5) {
        local_d0 = (_Hash_node_base *)((long)&p_Var25->_M_nxt + (uVar22 & 0xffffffffffffffe0));
        lVar28 = ((long)uVar22 >> 5) + 1;
        p_Var25 = p_Var25 + 2;
        do {
          sVar14 = std::
                   unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)auVar15,ppBVar24);
          if (sVar14 == 0) {
            p_Var25 = p_Var25 + -2;
            p_Var18 = local_38;
            goto LAB_00771a44;
          }
          sVar14 = std::
                   unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)auVar15,ppBVar24);
          if (sVar14 == 0) {
            p_Var25 = p_Var25 + -1;
            p_Var18 = local_38;
            goto LAB_00771a44;
          }
          sVar14 = std::
                   unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)auVar15,ppBVar24);
          p_Var18 = local_38;
          if (sVar14 == 0) goto LAB_00771a44;
          sVar14 = std::
                   unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)auVar15,ppBVar24);
          if (sVar14 == 0) {
            p_Var25 = p_Var25 + 1;
            p_Var18 = local_38;
            goto LAB_00771a44;
          }
          lVar28 = lVar28 + -1;
          p_Var25 = p_Var25 + 4;
        } while (1 < lVar28);
        uVar22 = (long)p_Var30 - (long)local_d0;
        p_Var25 = local_d0;
      }
      p_Var18 = local_38;
      lVar28 = (long)uVar22 >> 3;
      if (lVar28 == 1) {
LAB_00771a22:
        sVar14 = std::
                 unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                          *)auVar15,ppBVar24);
        if (sVar14 != 0) {
          p_Var25 = p_Var30;
        }
LAB_00771a44:
        p_Var17 = local_d8;
        uVar22 = local_e0;
        if ((p_Var25 != p_Var30) && (p_Var19 = p_Var25 + 1, p_Var18 = local_38, p_Var19 != p_Var30))
        {
          do {
            p_Var18 = p_Var19->_M_nxt;
            sVar14 = std::
                     unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                     ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                              *)local_70,ppBVar24);
            if (sVar14 != 0) {
              p_Var25->_M_nxt = p_Var18;
              p_Var25 = p_Var25 + 1;
            }
            p_Var19 = p_Var19 + 1;
          } while (p_Var19 != p_Var30);
          p_Var30 = (queue._M_h._M_single_bucket)->_M_nxt[0xd]._M_nxt;
          p_Var17 = *(_Hash_node_base **)((long)local_38 + 0x60);
          uVar22 = (long)p_Var30 - (long)*(_Hash_node_base **)((long)local_38 + 0x60);
          p_Var18 = local_38;
        }
        if (p_Var25 != p_Var30) {
          p_Var17 = (_Hash_node_base *)((long)&p_Var17->_M_nxt + uVar22);
          p_Var19 = p_Var30;
          if (*(_Hash_node_base **)((long)p_Var18 + 0x68) != p_Var30) {
            memmove(p_Var25,p_Var17,
                    (long)*(_Hash_node_base **)((long)p_Var18 + 0x68) - (long)p_Var30);
            p_Var17 = *(_Hash_node_base **)((long)p_Var18 + 0x68);
            p_Var19 = p_Var17;
          }
          p_Var25 = (_Hash_node_base *)((long)p_Var25 + ((long)p_Var19 - (long)p_Var30));
          if (p_Var17 != p_Var25) {
            *(_Hash_node_base **)((long)p_Var18 + 0x68) = p_Var25;
          }
        }
      }
      else {
        if (lVar28 == 2) {
LAB_007719cf:
          sVar14 = std::
                   unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)auVar15,ppBVar24);
          if (sVar14 != 0) {
            p_Var25 = p_Var25 + 1;
            goto LAB_00771a22;
          }
          goto LAB_00771a44;
        }
        if (lVar28 == 3) {
          sVar14 = std::
                   unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)auVar15,ppBVar24);
          if (sVar14 != 0) {
            p_Var25 = p_Var25 + 1;
            goto LAB_007719cf;
          }
          goto LAB_00771a44;
        }
      }
      ppBVar24 = _live;
      auVar15 = local_70;
      local_38 = (queue._M_h._M_single_bucket)->_M_nxt;
      local_d8 = local_38[9]._M_nxt;
      p_Var30 = local_38[10]._M_nxt;
      uVar22 = (long)p_Var30 - (long)local_d8;
      p_Var25 = local_d8;
      local_e0 = uVar22;
      if (0 < (long)uVar22 >> 5) {
        local_d0 = (_Hash_node_base *)((long)&local_d8->_M_nxt + (uVar22 & 0xffffffffffffffe0));
        lVar28 = ((long)uVar22 >> 5) + 1;
        p_Var25 = local_d8 + 2;
        do {
          sVar14 = std::
                   unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)auVar15,ppBVar24);
          if (sVar14 == 0) {
            p_Var25 = p_Var25 + -2;
            goto LAB_00771c42;
          }
          sVar14 = std::
                   unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)auVar15,ppBVar24);
          if (sVar14 == 0) {
            p_Var25 = p_Var25 + -1;
            goto LAB_00771c42;
          }
          sVar14 = std::
                   unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)auVar15,ppBVar24);
          if (sVar14 == 0) goto LAB_00771c42;
          sVar14 = std::
                   unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)auVar15,ppBVar24);
          if (sVar14 == 0) {
            p_Var25 = p_Var25 + 1;
            goto LAB_00771c42;
          }
          lVar28 = lVar28 + -1;
          p_Var25 = p_Var25 + 4;
        } while (1 < lVar28);
        uVar22 = (long)p_Var30 - (long)local_d0;
        p_Var25 = local_d0;
      }
      ppBVar24 = _live;
      auVar15 = local_70;
      lVar28 = (long)uVar22 >> 3;
      if (lVar28 == 3) {
        sVar14 = std::
                 unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                          *)local_70,_live);
        if (sVar14 != 0) {
          p_Var25 = p_Var25 + 1;
          goto LAB_00771c10;
        }
      }
      else {
        if (lVar28 == 2) {
LAB_00771c10:
          sVar14 = std::
                   unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)auVar15,ppBVar24);
          if (sVar14 == 0) goto LAB_00771c42;
          p_Var25 = p_Var25 + 1;
        }
        else {
          pBVar26 = (BasicBlock *)queue._M_h._M_single_bucket;
          if (lVar28 != 1) goto LAB_00771ce7;
        }
        sVar14 = std::
                 unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                 ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                          *)auVar15,ppBVar24);
        if (sVar14 != 0) {
          p_Var25 = p_Var30;
        }
      }
LAB_00771c42:
      p_Var18 = local_d8;
      uVar22 = local_e0;
      if ((p_Var25 != p_Var30) && (p_Var17 = p_Var25 + 1, p_Var17 != p_Var30)) {
        do {
          p_Var18 = p_Var17->_M_nxt;
          sVar14 = std::
                   unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                   ::count((unordered_set<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*,_std::hash<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::equal_to<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>,_std::allocator<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock_*>_>
                            *)local_70,ppBVar24);
          if (sVar14 != 0) {
            p_Var25->_M_nxt = p_Var18;
            p_Var25 = p_Var25 + 1;
          }
          p_Var17 = p_Var17 + 1;
        } while (p_Var17 != p_Var30);
        p_Var30 = (queue._M_h._M_single_bucket)->_M_nxt[10]._M_nxt;
        p_Var18 = local_38[9]._M_nxt;
        uVar22 = (long)p_Var30 - (long)local_38[9]._M_nxt;
      }
      p_Var17 = local_38;
      pBVar26 = (BasicBlock *)queue._M_h._M_single_bucket;
      if (p_Var25 != p_Var30) {
        p_Var18 = (_Hash_node_base *)((long)&p_Var18->_M_nxt + uVar22);
        p_Var19 = p_Var30;
        if (local_38[10]._M_nxt != p_Var30) {
          memmove(p_Var25,p_Var18,(long)local_38[10]._M_nxt - (long)p_Var30);
          p_Var18 = p_Var17[10]._M_nxt;
          p_Var19 = p_Var18;
        }
        p_Var25 = (_Hash_node_base *)((long)p_Var25 + ((long)p_Var19 - (long)p_Var30));
        if (p_Var18 != p_Var25) {
          p_Var17[10]._M_nxt = p_Var25;
        }
      }
    }
LAB_00771ce7:
    pBVar26 = (BasicBlock *)
              &(pBVar26->contents).start.super_vector<unsigned_int,_std::allocator<unsigned_int>_>.
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    puVar10 = walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
              super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.
              basicBlocks.
              super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    auVar15 = local_70;
    ppBVar24 = _live;
    walker.super_LivenessWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>_>.
    super_CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>.basicBlocks.
    super__Vector_base<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>,_std::allocator<std::unique_ptr<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock,_std::default_delete<wasm::CFGWalker<ParamLiveness,_wasm::Visitor<ParamLiveness,_void>,_wasm::Liveness>::BasicBlock>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar11;
  } while( true );
}

Assistant:

std::unordered_set<Index> getUsedParams(Function* func, Module* module) {
  // To find which params are used, compute liveness at the entry.
  // TODO: We could write bespoke code here rather than reuse LivenessWalker, as
  //       we only need liveness at the entry. The code below computes it for
  //       the param indexes in the entire function. However, there are usually
  //       very few params (compared to locals, which we ignore here), so this
  //       may be fast enough, and is very simple.
  struct ParamLiveness
    : public LivenessWalker<ParamLiveness, Visitor<ParamLiveness>> {
    using Super = LivenessWalker<ParamLiveness, Visitor<ParamLiveness>>;

    // Branches outside of the function can be ignored, as we only look at
    // locals, which vanish when we leave.
    bool ignoreBranchesOutsideOfFunc = true;

    // Ignore unreachable code and non-params.
    static void doVisitLocalGet(ParamLiveness* self, Expression** currp) {
      auto* get = (*currp)->cast<LocalGet>();
      if (self->currBasicBlock && self->getFunction()->isParam(get->index)) {
        Super::doVisitLocalGet(self, currp);
      }
    }
    static void doVisitLocalSet(ParamLiveness* self, Expression** currp) {
      auto* set = (*currp)->cast<LocalSet>();
      if (self->currBasicBlock && self->getFunction()->isParam(set->index)) {
        Super::doVisitLocalSet(self, currp);
      }
    }
  } walker;
  walker.setModule(module);
  walker.walkFunction(func);

  if (!walker.entry) {
    // Empty function: nothing is used.
    return {};
  }

  // We now have a sorted vector of the live params at the entry. Convert that
  // to a set.
  auto& sortedLiveness = walker.entry->contents.start;
  std::unordered_set<Index> usedParams;
  for (auto live : sortedLiveness) {
    usedParams.insert(live);
  }
  return usedParams;
}